

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_number_constructor(JSContext *ctx,JSValue new_target,int argc,JSValue *argv)

{
  JSValue val_00;
  JSValue obj_00;
  JSValue v;
  JSValue JVar1;
  JSValue ctor;
  int iVar2;
  int iVar3;
  int in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  JSValue JVar4;
  JSValue obj;
  JSValue val;
  JSValueUnion local_a8;
  JSValueUnion local_a0;
  JSValueUnion local_98;
  JSValueUnion in_stack_ffffffffffffff78;
  JSValueUnion in_stack_ffffffffffffff80;
  JSValueUnion local_60;
  undefined4 local_38;
  JSContext *in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  uint uStack_c;
  
  local_38 = (undefined4)in_RDX;
  iVar3 = (int)((ulong)in_RDX >> 0x20);
  if (in_ECX == 0) {
    in_stack_ffffffffffffffe4 = 0;
    in_stack_ffffffffffffff78.ptr = (void *)((ulong)uStack_c << 0x20);
    in_stack_ffffffffffffff80.float64 = 0.0;
    local_60.float64 = 0.0;
    local_98.ptr = in_stack_ffffffffffffff78.ptr;
  }
  else {
    JVar4.tag = (int64_t)in_stack_ffffffffffffff80.ptr;
    JVar4.u.float64 = in_stack_ffffffffffffff78.float64;
    JVar4 = JS_ToNumeric((JSContext *)local_98,JVar4);
    local_98 = JVar4.u;
    local_60 = (JSValueUnion)JVar4.tag;
    iVar2 = JS_IsException(JVar4);
    local_a8 = local_98;
    if (iVar2 != 0) goto LAB_0015017f;
  }
  v.tag._0_4_ = local_38;
  v.u = (JSValueUnion)in_RSI;
  v.tag._4_4_ = iVar3;
  iVar2 = JS_IsUndefined(v);
  local_a8 = local_98;
  if (iVar2 == 0) {
    ctor.tag._0_4_ = in_stack_ffffffffffffffe0;
    ctor.u = (JSValueUnion)in_stack_ffffffffffffffd8;
    ctor.tag._4_4_ = in_stack_ffffffffffffffe4;
    JVar4 = js_create_from_ctor(in_stack_ffffffffffffffd0,ctor,iVar3);
    local_a8 = JVar4.u;
    local_a0 = (JSValueUnion)JVar4.tag;
    iVar3 = JS_IsException(JVar4);
    local_60 = local_a0;
    if (iVar3 == 0) {
      obj_00.tag = (int64_t)local_98.ptr;
      obj_00.u.ptr = local_a0.ptr;
      val_00.tag = (int64_t)local_a8.ptr;
      val_00.u.float64 = in_stack_ffffffffffffff80.float64;
      JS_SetObjectData((JSContext *)in_stack_ffffffffffffff78.ptr,obj_00,val_00);
      local_60 = local_a0;
    }
  }
LAB_0015017f:
  JVar1.tag = (int64_t)local_60.ptr;
  JVar1.u.float64 = local_a8.float64;
  return JVar1;
}

Assistant:

static JSValue js_number_constructor(JSContext *ctx, JSValueConst new_target,
                                     int argc, JSValueConst *argv)
{
    JSValue val, obj;
    if (argc == 0) {
        val = JS_NewInt32(ctx, 0);
    } else {
        val = JS_ToNumeric(ctx, argv[0]);
        if (JS_IsException(val))
            return val;
        switch(JS_VALUE_GET_TAG(val)) {
#ifdef CONFIG_BIGNUM
        case JS_TAG_BIG_INT:
        case JS_TAG_BIG_FLOAT:
            {
                JSBigFloat *p = JS_VALUE_GET_PTR(val);
                double d;
                bf_get_float64(&p->num, &d, BF_RNDN);
                JS_FreeValue(ctx, val);
                val = __JS_NewFloat64(ctx, d);
            }
            break;
        case JS_TAG_BIG_DECIMAL:
            val = JS_ToStringFree(ctx, val);
            if (JS_IsException(val))
                return val;
            val = JS_ToNumberFree(ctx, val);
            if (JS_IsException(val))
                return val;
            break;
#endif
        default:
            break;
        }
    }
    if (!JS_IsUndefined(new_target)) {
        obj = js_create_from_ctor(ctx, new_target, JS_CLASS_NUMBER);
        if (!JS_IsException(obj))
            JS_SetObjectData(ctx, obj, val);
        return obj;
    } else {
        return val;
    }
}